

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

PClassAmmo * T_GetAmmo(svalue_t *t)

{
  uint uVar1;
  PClassActor *p;
  PClassAmmo *pPVar2;
  char *name;
  
  if (t->type == 0) {
    name = stringvalue(t);
  }
  else {
    uVar1 = intvalue(t);
    if (3 < uVar1) {
      script_error("ammo number out of range: %i",(ulong)uVar1);
      return (PClassAmmo *)0x0;
    }
    name = _ZZL9T_GetAmmoRK8svalue_tE7DefAmmo_rel +
           *(int *)(_ZZL9T_GetAmmoRK8svalue_tE7DefAmmo_rel + (ulong)uVar1 * 4);
  }
  p = PClass::FindActor(name);
  pPVar2 = dyn_cast<PClassAmmo>((DObject *)p);
  if (pPVar2 == (PClassAmmo *)0x0) {
    pPVar2 = (PClassAmmo *)0x0;
    script_error("unknown ammo type : %s",name);
  }
  return pPVar2;
}

Assistant:

static PClassAmmo * T_GetAmmo(const svalue_t &t)
{
	const char * p;

	if (t.type==svt_string)
	{
		p=stringvalue(t);
	}
	else	
	{
		// backwards compatibility with Legacy.
		// allow only Doom's standard types here!
		static const char * DefAmmo[]={"Clip","Shell","Cell","RocketAmmo"};
		int ammonum = intvalue(t);
		if(ammonum < 0 || ammonum >= 4)	
		{
			script_error("ammo number out of range: %i", ammonum);
			return NULL;
		}
		p=DefAmmo[ammonum];
	}
	PClassAmmo * am=dyn_cast<PClassAmmo>(PClass::FindActor(p));
	if (am == NULL)
	{
		script_error("unknown ammo type : %s", p);
		return NULL;
	}
	return am;

}